

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_13c40::extract_tar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,bool verbose,cmTarExtractTimestamps extractTimestamps,bool extract)

{
  pointer pbVar1;
  FILE *__stream;
  archive_entry *entry_00;
  cmTarExtractTimestamps cVar2;
  bool bVar3;
  wchar_t wVar4;
  uint uVar5;
  mode_t mVar6;
  int iVar7;
  wchar_t wVar8;
  archive *a;
  archive *_a;
  archive *paVar9;
  char *pcVar10;
  string *__s;
  la_int64_t lVar11;
  size_t sVar12;
  dev_t dVar13;
  dev_t dVar14;
  size_t sVar15;
  tm *__tp;
  la_ssize_t r;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__format;
  pointer __rhs;
  allocator<char> local_121;
  archive_entry *entry;
  archive *local_118;
  size_t size;
  cmTarExtractTimestamps local_ec;
  char tmp [100];
  char *p;
  time_t tim;
  cmLocaleRAII localeRAII;
  
  cmLocaleRAII::cmLocaleRAII(&localeRAII);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  paVar9 = archive_match_new();
  if (paVar9 == (archive *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)tmp,"Out of memory",(allocator<char> *)&size);
    cmSystemTools::Error((string *)tmp);
LAB_00114c62:
    std::__cxx11::string::~string((string *)tmp);
  }
  else {
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar10 = extraout_RDX;
    local_118 = paVar9;
    for (__rhs = (files->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
      wVar4 = archive_match_include_pattern(local_118,(__rhs->_M_dataplus)._M_p);
      if (wVar4 != L'\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                       "Failed to add to inclusion list: ",__rhs);
        cmSystemTools::Error((string *)tmp);
        goto LAB_00114c62;
      }
      pcVar10 = extraout_RDX_00;
    }
    cmsys::Encoding::ToWide_abi_cxx11_
              ((wstring *)tmp,(Encoding *)(outFileName->_M_dataplus)._M_p,pcVar10);
    wVar4 = archive_read_open_filename_w(a,(wchar_t *)tmp._0_8_,0x2800);
    std::__cxx11::wstring::~wstring((wstring *)tmp);
    cVar2 = extractTimestamps;
    if (wVar4 == L'\0') {
LAB_00114c94:
      do {
        do {
          local_ec = cVar2;
          wVar4 = archive_read_next_header(a,&entry);
          if (wVar4 != L'\0') {
            if (wVar4 != L'\x01') {
              ArchiveError("Problem with archive_read_next_header(): ",a);
            }
            goto LAB_00115104;
          }
          wVar4 = archive_match_excluded(local_118,entry);
          entry_00 = entry;
          __stream = _stdout;
          cVar2 = local_ec;
        } while (wVar4 != L'\0');
        if (verbose) {
          if (extract) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)tmp,"x ",(allocator<char> *)&size);
            cmSystemTools::Stdout((string *)tmp);
            std::__cxx11::string::~string((string *)tmp);
            cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
            cmSystemTools::Stdout((string *)tmp);
            std::__cxx11::string::~string((string *)tmp);
          }
          else {
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
              time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
            }
            pcVar10 = archive_entry_strmode((archive_entry_conflict *)entry_00);
            uVar5 = archive_entry_nlink(entry_00);
            fprintf(__stream,"%s %d ",pcVar10,(ulong)uVar5);
            __s = (string *)archive_entry_uname(entry_00);
            if ((__s == (string *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
              lVar11 = archive_entry_uid(entry_00);
              snprintf(tmp,100,"%lu ",lVar11);
              __s = (string *)tmp;
            }
            sVar12 = strlen((char *)__s);
            if (sVar12 < 7) {
              sVar12 = 6;
            }
            fprintf(__stream,"%-*s ",sVar12 & 0xffffffff,__s);
            pcVar10 = archive_entry_gname(entry_00);
            if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
              lVar11 = archive_entry_gid(entry_00);
              snprintf(tmp,100,"%lu",lVar11);
              sVar12 = strlen(tmp);
              fputs(tmp,__stream);
            }
            else {
              fputs(pcVar10,__stream);
              sVar12 = strlen(pcVar10);
            }
            mVar6 = archive_entry_filetype(entry_00);
            if ((mVar6 == 0x2000) || (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x6000)) {
              dVar13 = archive_entry_rdevmajor(entry_00);
              dVar14 = archive_entry_rdevminor(entry_00);
              snprintf(tmp,100,"%lu,%lu",dVar13,dVar14);
            }
            else {
              lVar11 = archive_entry_size(entry_00);
              snprintf(tmp,100,"%lu",lVar11);
            }
            sVar15 = strlen(tmp);
            iVar7 = (int)(sVar15 + sVar12) + 1;
            if (sVar15 + sVar12 < 0xd) {
              iVar7 = 0xd;
            }
            fprintf(__stream,"%*s",(ulong)(uint)(iVar7 - (int)sVar12),(string *)tmp);
            tim = archive_entry_mtime(entry_00);
            pcVar10 = "%e %b %H:%M";
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
                tim) {
              pcVar10 = "%e %b  %Y";
            }
            if (tim < (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now +
                      -0xf099c0) {
              pcVar10 = "%e %b  %Y";
            }
            __tp = localtime(&tim);
            strftime(tmp,100,pcVar10,__tp);
            fprintf(__stream," %s ",(string *)tmp);
            cm_archive_entry_pathname_abi_cxx11_((string *)&size,entry_00);
            fputs((char *)size,__stream);
            std::__cxx11::string::~string((string *)&size);
            pcVar10 = archive_entry_hardlink(entry_00);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = archive_entry_symlink(entry_00);
              if (pcVar10 != (char *)0x0) {
                pcVar10 = archive_entry_symlink(entry_00);
                __format = " -> %s";
                goto LAB_00114fef;
              }
            }
            else {
              pcVar10 = archive_entry_hardlink(entry_00);
              __format = " link to %s";
LAB_00114fef:
              fprintf(__stream,__format,pcVar10);
            }
            fflush(__stream);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)tmp,"\n",(allocator<char> *)&size);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          cVar2 = local_ec;
          if (!extract) goto LAB_00114c94;
        }
        else if (!extract) {
          cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)tmp,"\n",(allocator<char> *)&size);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          cVar2 = local_ec;
          goto LAB_00114c94;
        }
        if ((local_ec == Yes) &&
           (wVar4 = archive_write_disk_set_options(_a,L'\x04'), wVar4 != L'\0')) {
          ArchiveError("Problem with archive_write_disk_set_options(): ",_a);
          goto LAB_00115104;
        }
        wVar4 = archive_write_header(_a,entry);
        if (wVar4 != L'\0') {
          ArchiveError("Problem with archive_write_header(): ",_a);
          cm_archive_entry_pathname_abi_cxx11_((string *)&size,entry);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                         "Current file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size)
          ;
          cmSystemTools::Error((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          std::__cxx11::string::~string((string *)&size);
          goto LAB_00115104;
        }
LAB_0011506d:
        iVar7 = archive_read_data_block(a,(void **)tmp,&size,&tim);
        if (iVar7 != 1) {
          bVar3 = la_diagnostic(a,(long)iVar7);
          if (bVar3) goto code_r0x00115096;
          goto LAB_001150eb;
        }
        wVar4 = archive_write_finish_entry(_a);
        cVar2 = local_ec;
      } while (wVar4 == L'\0');
      ArchiveError("Problem with archive_write_finish_entry(): ",_a);
LAB_00115104:
      bVar3 = false;
      while (wVar8 = archive_match_path_unmatched_inclusions_next(local_118,&p), wVar8 == L'\0') {
        std::__cxx11::string::string<std::allocator<char>>((string *)&tim,p,&local_121);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                       "tar: ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tim);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                       ": Not found in archive");
        cmSystemTools::Error
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp);
        std::__cxx11::string::~string((string *)tmp);
        std::__cxx11::string::~string((string *)&size);
        std::__cxx11::string::~string((string *)&tim);
        bVar3 = true;
      }
      if (!bVar3) {
        if (wVar8 != L'\xffffffe2') {
          archive_match_free(local_118);
          archive_write_free(_a);
          archive_read_close(a);
          archive_read_free(a);
          bVar3 = (uint)wVar4 < 2;
          goto LAB_00114c6e;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)tmp,"tar: Out of memory",(allocator<char> *)&size);
        cmSystemTools::Error((string *)tmp);
        goto LAB_00114c62;
      }
    }
    else {
      ArchiveError("Problem with archive_read_open_file(): ",a);
      archive_write_free(_a);
      archive_read_close(a);
    }
  }
  bVar3 = false;
LAB_00114c6e:
  cmLocaleRAII::~cmLocaleRAII(&localeRAII);
  return bVar3;
code_r0x00115096:
  r = archive_write_data_block(_a,(void *)tmp._0_8_,size,tim);
  bVar3 = la_diagnostic(a,r);
  if (!bVar3) {
LAB_001150eb:
    wVar4 = L'\0';
    goto LAB_00115104;
  }
  goto LAB_0011506d;
}

Assistant:

bool extract_tar(const std::string& outFileName,
                 const std::vector<std::string>& files, bool verbose,
                 cmSystemTools::cmTarExtractTimestamps extractTimestamps,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;

  struct archive* matching = archive_match_new();
  if (matching == nullptr) {
    cmSystemTools::Error("Out of memory");
    return false;
  }

  for (const auto& filename : files) {
    if (archive_match_include_pattern(matching, filename.c_str()) !=
        ARCHIVE_OK) {
      cmSystemTools::Error("Failed to add to inclusion list: " + filename);
      return false;
    }
  }

  int r = cm_archive_read_open_file(a, outFileName.c_str(), 10240);
  if (r) {
    ArchiveError("Problem with archive_read_open_file(): ", a);
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      ArchiveError("Problem with archive_read_next_header(): ", a);
      break;
    }

    if (archive_match_excluded(matching, entry)) {
      continue;
    }

    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      if (extractTimestamps == cmSystemTools::cmTarExtractTimestamps::Yes) {
        r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_disk_set_options(): ", ext);
          break;
        }
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_finish_entry(): ", ext);
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        ArchiveError("Problem with archive_write_header(): ", ext);
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }